

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O1

void aom_h_predictor_8x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar12 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar8 = *(undefined1 (*) [16])left;
  auVar4._0_14_ = auVar8._0_14_;
  auVar4[0xe] = auVar8[7];
  auVar4[0xf] = auVar8[7];
  auVar3._14_2_ = auVar4._14_2_;
  auVar3._0_13_ = auVar8._0_13_;
  auVar3[0xd] = auVar8[6];
  auVar12._13_3_ = auVar3._13_3_;
  auVar12._0_12_ = auVar8._0_12_;
  auVar12[0xc] = auVar8[6];
  auVar2._12_4_ = auVar12._12_4_;
  auVar2._0_11_ = auVar8._0_11_;
  auVar2[0xb] = auVar8[5];
  auVar11._11_5_ = auVar2._11_5_;
  auVar11._0_10_ = auVar8._0_10_;
  auVar11[10] = auVar8[5];
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._0_9_ = auVar8._0_9_;
  auVar10[9] = auVar8[4];
  auVar9._9_7_ = auVar10._9_7_;
  auVar9._0_8_ = auVar8._0_8_;
  auVar9[8] = auVar8[4];
  auVar6._8_8_ = auVar9._8_8_;
  auVar6[7] = auVar8[3];
  auVar6[6] = auVar8[3];
  auVar6[5] = auVar8[2];
  auVar6[4] = auVar8[2];
  auVar6[3] = auVar8[1];
  auVar6[2] = auVar8[1];
  auVar6[1] = auVar8[0];
  auVar6[0] = auVar8[0];
  auVar1[1] = auVar8[8];
  auVar1[0] = auVar8[8];
  auVar1[2] = auVar8[9];
  auVar1[3] = auVar8[9];
  auVar1[4] = auVar8[10];
  auVar1[5] = auVar8[10];
  auVar1[6] = auVar8[0xb];
  auVar1[7] = auVar8[0xb];
  auVar1[8] = auVar8[0xc];
  auVar1[9] = auVar8[0xc];
  auVar1[10] = auVar8[0xd];
  auVar1[0xb] = auVar8[0xd];
  auVar7[0xc] = auVar8[0xe];
  auVar7._0_12_ = auVar1;
  auVar7[0xd] = auVar8[0xe];
  auVar7[0xf] = auVar8[0xf];
  auVar7[0xe] = auVar7[0xf];
  auVar8 = pshuflw(in_XMM2,auVar6,0);
  auVar10 = pshuflw(in_XMM3,auVar6,0x55);
  auVar11 = pshuflw(in_XMM4,auVar6,0xaa);
  auVar12 = pshuflw(in_XMM5,auVar6,0xff);
  *(long *)dst = auVar8._0_8_;
  *(long *)(dst + stride) = auVar10._0_8_;
  *(long *)(dst + stride * 2) = auVar11._0_8_;
  *(long *)(dst + stride * 3) = auVar12._0_8_;
  auVar5._8_4_ = auVar9._8_4_;
  auVar5._0_8_ = auVar6._8_8_;
  auVar5._12_4_ = auVar2._12_4_;
  auVar9 = pshuflw(auVar8,auVar5,0);
  auVar10 = pshuflw(auVar10,auVar5,0x55);
  auVar11 = pshuflw(auVar11,auVar5,0xaa);
  auVar8 = pshuflw(auVar5,auVar5,0xff);
  *(long *)(dst + stride * 4) = auVar9._0_8_;
  *(long *)(dst + stride * 5) = auVar10._0_8_;
  *(long *)(dst + stride * 6) = auVar11._0_8_;
  *(long *)(dst + stride * 7) = auVar8._0_8_;
  auVar6 = pshuflw(auVar8,auVar7,0);
  auVar9 = pshuflw(auVar9,auVar7,0x55);
  auVar10 = pshuflw(auVar10,auVar7,0xaa);
  auVar8 = pshuflw(auVar11,auVar7,0xff);
  *(long *)(dst + stride * 8) = auVar6._0_8_;
  *(long *)(dst + stride * 9) = auVar9._0_8_;
  *(long *)(dst + stride * 10) = auVar10._0_8_;
  *(long *)(dst + stride * 0xb) = auVar8._0_8_;
  auVar8._8_4_ = auVar1._8_4_;
  auVar8._12_4_ = auVar7._12_4_;
  auVar8._4_4_ = auVar8._12_4_;
  auVar8._0_4_ = auVar8._8_4_;
  auVar7 = pshuflw(auVar6,auVar8,0);
  auVar6 = pshuflw(auVar9,auVar8,0x55);
  auVar9 = pshuflw(auVar10,auVar8,0xaa);
  auVar8 = pshuflw(auVar8,auVar8,0xff);
  *(long *)(dst + stride * 0xc) = auVar7._0_8_;
  *(long *)(dst + stride * 0xd) = auVar6._0_8_;
  *(long *)(dst + stride * 0xe) = auVar9._0_8_;
  *(long *)(dst + stride * 0xf) = auVar8._0_8_;
  return;
}

Assistant:

static inline void h_predictor_8x16xc(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above, const uint8_t *left,
                                      int count) {
  (void)above;
  for (int i = 0; i < count; ++i) {
    const __m128i left_col = _mm_load_si128((__m128i const *)left);
    __m128i left_col_low = _mm_unpacklo_epi8(left_col, left_col);
    __m128i left_col_high = _mm_unpackhi_epi8(left_col, left_col);

    __m128i row0 = _mm_shufflelo_epi16(left_col_low, 0);
    __m128i row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
    __m128i row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
    __m128i row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    left_col_low = _mm_unpackhi_epi64(left_col_low, left_col_low);
    row0 = _mm_shufflelo_epi16(left_col_low, 0);
    row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    row0 = _mm_shufflelo_epi16(left_col_high, 0);
    row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    left_col_high = _mm_unpackhi_epi64(left_col_high, left_col_high);
    row0 = _mm_shufflelo_epi16(left_col_high, 0);
    row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;
    left += 16;
  }
}